

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailcallFallbackFunction
          (ParseFunctionGenerator *this,Formatter *format)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->options_->tctable_mode == kTCTableNever) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x178);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: should_generate_tctable(): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  Formatter::operator()<>
            (format,
             "const char* $classname$::Tct_ParseFallback(PROTOBUF_TC_PARAM_DECL) {\n#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) return nullptr\n"
            );
  Formatter::Indent(format);
  Formatter::operator()<>(format,"auto* typed_msg = static_cast<$classname$*>(msg);\n");
  if (0 < this->num_hasbits_) {
    Formatter::operator()<>(format,"typed_msg->_has_bits_[0] = hasbits;\n");
  }
  std::__cxx11::string::string((string *)&local_50,"msg",(allocator *)&local_51);
  Formatter::Set<char[12]>(format,(string *)&local_50,(char (*) [12])"typed_msg->");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"this",(allocator *)&local_51);
  Formatter::Set<char[10]>(format,(string *)&local_50,(char (*) [10])"typed_msg");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"has_bits",(allocator *)&local_51);
  Formatter::Set<char[22]>(format,(string *)&local_50,(char (*) [22])"typed_msg->_has_bits_");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"next_tag",(allocator *)&local_51);
  Formatter::Set<char[14]>(format,(string *)&local_50,(char (*) [14])"goto next_tag");
  std::__cxx11::string::~string((string *)&local_50);
  GenerateParseIterationBody
            (this,format,this->descriptor_,
             &((this->tc_table_info_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
               .super__Head_base<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_false>.
              _M_head_impl)->fallback_fields);
  Formatter::Outdent(format);
  Formatter::operator()<>(format,"next_tag:\nmessage_done:\n  return ptr;\n#undef CHK_\n}\n");
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailcallFallbackFunction(
    Formatter& format) {
  GOOGLE_CHECK(should_generate_tctable());
  format(
      "const char* $classname$::Tct_ParseFallback(PROTOBUF_TC_PARAM_DECL) {\n"
      "#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) return nullptr\n");
  format.Indent();
  format("auto* typed_msg = static_cast<$classname$*>(msg);\n");

  if (num_hasbits_ > 0) {
    // Sync hasbits
    format("typed_msg->_has_bits_[0] = hasbits;\n");
  }

  format.Set("msg", "typed_msg->");
  format.Set("this", "typed_msg");
  format.Set("has_bits", "typed_msg->_has_bits_");
  format.Set("next_tag", "goto next_tag");
  GenerateParseIterationBody(format, descriptor_,
                             tc_table_info_->fallback_fields);

  format.Outdent();
  format(
      "next_tag:\n"
      "message_done:\n"
      "  return ptr;\n"
      "#undef CHK_\n"
      "}\n");
}